

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_sha2.c
# Opt level: O0

void cmSHA256_Internal_Last(SHA_CTX *context)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  sha_word64 tmp;
  uint usedspace;
  SHA_CTX *context_local;
  
  uVar2 = (context->s256).bitcount >> 3;
  uVar1 = (uint)uVar2 & 0x3f;
  uVar3 = (context->s256).bitcount >> 0x20 | (context->s256).bitcount << 0x20;
  uVar3 = (uVar3 & 0xff00ff00ff00ff00) >> 8 | (uVar3 & 0xff00ff00ff00ff) << 8;
  (context->s256).bitcount = (uVar3 & 0xffff0000ffff0000) >> 0x10 | (uVar3 & 0xffff0000ffff) << 0x10
  ;
  if ((uVar2 & 0x3f) == 0) {
    memset((context->s1).buffer + 8,0,0x38);
    (context->s1).buffer[8] = 0x80;
  }
  else {
    uVar4 = uVar1 + 1;
    *(undefined1 *)((long)context + (ulong)uVar1 + 0x28) = 0x80;
    if (uVar4 < 0x39) {
      memset((void *)((long)context + (ulong)uVar4 + 0x28),0,(ulong)(0x38 - uVar4));
    }
    else {
      if (uVar4 < 0x40) {
        memset((void *)((long)context + (ulong)uVar4 + 0x28),0,(ulong)(0x40 - uVar4));
      }
      cmSHA256_Internal_Transform(context,(sha_word32 *)((context->s1).buffer + 8));
      memset((context->s1).buffer + 8,0,0x38);
    }
  }
  *(cm_sha2_uint64_t *)((context->s256).buffer + 0x38) = (context->s256).bitcount;
  cmSHA256_Internal_Transform(context,(sha_word32 *)((context->s1).buffer + 8));
  return;
}

Assistant:

void SHA256_Internal_Last(SHA_CTX* context) {
	unsigned int	usedspace;

	usedspace = (unsigned int)((context->s256.bitcount >> 3) % 64);
#if BYTE_ORDER == LITTLE_ENDIAN
	/* Convert FROM host byte order */
	REVERSE64(context->s256.bitcount,context->s256.bitcount);
#endif
	if (usedspace > 0) {
		/* Begin padding with a 1 bit: */
		context->s256.buffer[usedspace++] = 0x80;

		if (usedspace <= 56) {
			/* Set-up for the last transform: */
			MEMSET_BZERO(&context->s256.buffer[usedspace], 56 - usedspace);
		} else {
			if (usedspace < 64) {
				MEMSET_BZERO(&context->s256.buffer[usedspace], 64 - usedspace);
			}
			/* Do second-to-last transform: */
			SHA256_Internal_Transform(context, (const sha_word32*)context->s256.buffer);

			/* And set-up for the last transform: */
			MEMSET_BZERO(context->s256.buffer, 56);
		}
		/* Clean up: */
		usedspace = 0;
	} else {
		/* Set-up for the last transform: */
		MEMSET_BZERO(context->s256.buffer, 56);

		/* Begin padding with a 1 bit: */
		*context->s256.buffer = 0x80;
	}
	/* Set the bit count: */
	MEMCPY_BCOPY(&context->s256.buffer[56], &context->s256.bitcount,
		     sizeof(sha_word64));

	/* Final transform: */
	SHA256_Internal_Transform(context, (const sha_word32*)context->s256.buffer);
}